

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O0

int flvtag_initavc(flvtag_t *tag,uint32_t dts,int32_t cts,flvtag_frametype_t type)

{
  flvtag_frametype_t type_local;
  int32_t cts_local;
  uint32_t dts_local;
  flvtag_t *tag_local;
  
  flvtag_init(tag);
  flvtag_reserve(tag,0x805);
  *tag->data = '\t';
  tag->data[4] = (uint8_t)(dts >> 0x10);
  tag->data[5] = (uint8_t)(dts >> 8);
  tag->data[6] = (uint8_t)dts;
  tag->data[7] = (uint8_t)(dts >> 0x18);
  tag->data[8] = '\0';
  tag->data[9] = '\0';
  tag->data[10] = '\0';
  tag->data[0xb] = (byte)((type << 4) % 0xf0) | 7;
  tag->data[0xc] = '\x01';
  tag->data[0xd] = (uint8_t)((uint)cts >> 0x10);
  tag->data[0xe] = (uint8_t)((uint)cts >> 8);
  tag->data[0xf] = (uint8_t)cts;
  flvtag_updatesize(tag,5);
  return 1;
}

Assistant:

int flvtag_initavc(flvtag_t* tag, uint32_t dts, int32_t cts, flvtag_frametype_t type)
{
    flvtag_init(tag);
    flvtag_reserve(tag, 5 + FLVTAG_PREALOC);
    tag->data[0] = flvtag_type_video;
    tag->data[4] = dts >> 16;
    tag->data[5] = dts >> 8;
    tag->data[6] = dts >> 0;
    tag->data[7] = dts >> 24;
    tag->data[8] = 0; // StreamID
    tag->data[9] = 0; // StreamID
    tag->data[10] = 0; // StreamID
    // VideoTagHeader
    tag->data[11] = ((type << 4) % 0xF0) | 0x07; // CodecId
    tag->data[12] = 0x01; // AVC NALU
    tag->data[13] = cts >> 16;
    tag->data[14] = cts >> 8;
    tag->data[15] = cts >> 0;
    flvtag_updatesize(tag, 5);
    return 1;
}